

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O0

vector<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
* jsoncons::
  decode_traits<std::vector<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,std::default_delete<(anonymous_namespace)::ns::Shape_NMN>>,std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,std::default_delete<(anonymous_namespace)::ns::Shape_NMN>>>>,char,void>
  ::
  decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
            (basic_staj_cursor<char> *cursor,
            json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
            *decoder,error_code *ec)

{
  bool bVar1;
  staj_event_type sVar2;
  basic_staj_event<char> *pbVar3;
  error_code *in_RCX;
  long *in_RSI;
  error_code *in_RDI;
  error_code *in_stack_00000038;
  vector<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
  v;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  byte bVar4;
  vector<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
  *in_stack_ffffffffffffff90;
  error_code *this;
  
  this = in_RDI;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
  ::vector((vector<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
            *)0xc3a6ff);
  (**(code **)(*in_RSI + 0x10))();
  bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
  if (bVar1) {
    memset(this,0,0x18);
    std::
    vector<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
    ::vector((vector<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
              *)0xc3a743);
  }
  else {
    pbVar3 = (basic_staj_event<char> *)(**(code **)(*in_RSI + 0x20))();
    sVar2 = basic_staj_event<char>::event_type(pbVar3);
    if (sVar2 == begin_array) {
      (**(code **)(*in_RSI + 0x40))(in_RSI,in_RCX);
      while( true ) {
        pbVar3 = (basic_staj_event<char> *)(**(code **)(*in_RSI + 0x20))();
        sVar2 = basic_staj_event<char>::event_type(pbVar3);
        bVar4 = 0;
        if (sVar2 != end_array) {
          bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
          bVar4 = bVar1 ^ 0xff;
        }
        if ((bVar4 & 1) == 0) {
          std::
          vector<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
          ::vector((vector<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
                    *)pbVar3,
                   (vector<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
                    *)CONCAT17(bVar4,in_stack_ffffffffffffff88));
          goto LAB_00c3a8cb;
        }
        decode_traits<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,std::default_delete<(anonymous_namespace)::ns::Shape_NMN>>,char,void>
        ::
        decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
                  ((basic_staj_cursor<char> *)
                   v.
                   super__Vector_base<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                    *)v.
                      super__Vector_base<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,in_stack_00000038);
        std::
        vector<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
        ::push_back((vector<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
                     *)pbVar3,(value_type *)CONCAT17(bVar4,in_stack_ffffffffffffff88));
        std::
        unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>
                       *)pbVar3);
        bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
        if (bVar1) break;
        (**(code **)(*in_RSI + 0x40))(in_RSI,in_RCX);
      }
      memset(this,0,0x18);
      std::
      vector<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
      ::vector((vector<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
                *)0xc3a876);
    }
    else {
      std::error_code::operator=(this,(conv_errc)((ulong)pbVar3 >> 0x20));
      std::
      vector<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
      ::vector(in_stack_ffffffffffffff90,
               (vector<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    }
  }
LAB_00c3a8cb:
  std::
  vector<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
  ::~vector((vector<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
             *)this);
  return (vector<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::ns::Shape_NMN,_std::default_delete<(anonymous_namespace)::ns::Shape_NMN>_>_>_>
          *)in_RDI;
}

Assistant:

static T decode(basic_staj_cursor<CharT>& cursor, 
            json_decoder<Json,TempAllocator>& decoder, 
            std::error_code& ec)
        {
            T v;

            cursor.array_expected(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return T{};
            }
            if (cursor.current().event_type() != staj_event_type::begin_array)
            {
                ec = conv_errc::not_vector;
                return v;
            }
            cursor.next(ec);
            while (cursor.current().event_type() != staj_event_type::end_array && !ec)
            {
                v.push_back(decode_traits<value_type,CharT>::decode(cursor, decoder, ec));
                if (JSONCONS_UNLIKELY(ec)) {return T{};}
                //std::cout << "read next 10\n";
                cursor.next(ec);
            }
            return v;
        }